

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O0

int Au_ObjSuppSize(Au_Obj_t *pObj)

{
  int iVar1;
  Au_Ntk_t *p_00;
  Au_Ntk_t *p;
  Au_Obj_t *pObj_local;
  
  p_00 = Au_ObjNtk(pObj);
  Au_NtkIncrementTravId(p_00);
  iVar1 = Au_ObjId(pObj);
  iVar1 = Au_ObjSuppSize_rec(p_00,iVar1);
  return iVar1;
}

Assistant:

int Au_ObjSuppSize( Au_Obj_t * pObj )
{
    Au_Ntk_t * p = Au_ObjNtk(pObj);
    Au_NtkIncrementTravId( p );
    return Au_ObjSuppSize_rec( p, Au_ObjId(pObj) );
}